

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

share_channel *
share_add_channel(ssh_sharing_connstate *cs,uint downstream_id,uint upstream_id,uint server_id,
                 int state,int maxpkt)

{
  ssh_sharing_connstate *psVar1;
  share_channel *chan;
  int maxpkt_local;
  int state_local;
  uint server_id_local;
  uint upstream_id_local;
  uint downstream_id_local;
  ssh_sharing_connstate *cs_local;
  
  cs_local = (ssh_sharing_connstate *)safemalloc(1,0x38,0);
  cs_local->id = downstream_id;
  *(uint *)&cs_local->field_0x4 = upstream_id;
  *(uint *)&cs_local->sock = server_id;
  *(int *)&cs_local->parent = state;
  *(int *)((long)&cs_local->sock + 4) = maxpkt;
  cs_local->crLine = 0;
  cs_local->sent_verstring = false;
  cs_local->got_verstring = false;
  *(undefined2 *)&cs_local->field_0x1e = 0;
  cs_local->recvbuf[4] = '\0';
  cs_local->recvbuf[5] = '\0';
  cs_local->recvbuf[6] = '\0';
  cs_local->recvbuf[7] = '\0';
  cs_local->recvbuf[8] = '\0';
  cs_local->recvbuf[9] = '\0';
  cs_local->recvbuf[10] = '\0';
  cs_local->recvbuf[0xb] = '\0';
  cs_local->curr_packetlen = -1;
  cs_local->recvbuf[0xc] = '\0';
  cs_local->recvbuf[0xd] = '\0';
  cs_local->recvbuf[0xe] = '\0';
  cs_local->recvbuf[0xf] = '\0';
  cs_local->recvbuf[0x10] = '\0';
  psVar1 = (ssh_sharing_connstate *)add234(cs->channels_by_us,cs_local);
  if (psVar1 == cs_local) {
    if ((*(int *)&cs_local->parent != 3) &&
       (psVar1 = (ssh_sharing_connstate *)add234(cs->channels_by_server,cs_local),
       psVar1 != cs_local)) {
      del234(cs->channels_by_us,cs_local);
      safefree(cs_local);
      cs_local = (ssh_sharing_connstate *)0x0;
    }
  }
  else {
    safefree(cs_local);
    cs_local = (ssh_sharing_connstate *)0x0;
  }
  return (share_channel *)cs_local;
}

Assistant:

static struct share_channel *share_add_channel
    (struct ssh_sharing_connstate *cs, unsigned downstream_id,
     unsigned upstream_id, unsigned server_id, int state, int maxpkt)
{
    struct share_channel *chan = snew(struct share_channel);
    chan->downstream_id = downstream_id;
    chan->upstream_id = upstream_id;
    chan->server_id = server_id;
    chan->state = state;
    chan->downstream_maxpkt = maxpkt;
    chan->x11_auth_upstream = NULL;
    chan->x11_auth_data = NULL;
    chan->x11_auth_proto = -1;
    chan->x11_auth_datalen = 0;
    chan->x11_one_shot = false;
    if (add234(cs->channels_by_us, chan) != chan) {
        sfree(chan);
        return NULL;
    }
    if (chan->state != UNACKNOWLEDGED) {
        if (add234(cs->channels_by_server, chan) != chan) {
            del234(cs->channels_by_us, chan);
            sfree(chan);
            return NULL;
        }
    }
    return chan;
}